

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall flatbuffers::rust::RustGenerator::SetNameSpace(RustGenerator *this,Namespace *ns)

{
  const_reference pvVar1;
  const_reference __rhs;
  __type local_161;
  size_type_conflict local_160;
  size_type_conflict local_158;
  allocator<char> local_141;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  string local_b8;
  size_type_conflict local_98;
  size_t j_1;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  size_t j;
  size_t common_prefix_size;
  size_t new_size;
  size_t old_size;
  Namespace *ns_local;
  RustGenerator *this_local;
  
  if (this->cur_name_space_ != ns) {
    old_size = (size_t)ns;
    ns_local = (Namespace *)this;
    if (this->cur_name_space_ == (Namespace *)0x0) {
      local_158 = 0;
    }
    else {
      local_158 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this->cur_name_space_->components);
    }
    new_size = local_158;
    if (old_size == 0) {
      local_160 = 0;
    }
    else {
      local_160 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)old_size);
    }
    common_prefix_size = local_160;
    j = 0;
    while( true ) {
      local_161 = false;
      if ((j < new_size) && (local_161 = false, j < common_prefix_size)) {
        pvVar1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)old_size,j);
        __rhs = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&this->cur_name_space_->components,j);
        local_161 = std::operator==(pvVar1,__rhs);
      }
      if (local_161 == false) break;
      j = j + 1;
    }
    for (local_38 = new_size; j < local_38; local_38 = local_38 - 1) {
      pvVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->cur_name_space_->components,local_38 - 1);
      std::operator+(&local_58,"}  // pub mod ",pvVar1);
      CodeWriter::operator+=(&this->code_,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    if (new_size != j) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"",(allocator<char> *)((long)&j_1 + 7));
      CodeWriter::operator+=(&this->code_,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&j_1 + 7));
    }
    for (local_98 = j; local_98 != common_prefix_size; local_98 = local_98 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"#[allow(unused_imports, dead_code)]",&local_b9);
      CodeWriter::operator+=(&this->code_,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      pvVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)old_size,local_98);
      Namer::Namespace(&local_120,&(this->namer_).super_Namer,pvVar1);
      std::operator+(&local_100,"pub mod ",&local_120);
      std::operator+(&local_e0,&local_100," {");
      CodeWriter::operator+=(&this->code_,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      GenNamespaceImports(this,2);
    }
    if (common_prefix_size != j) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_141);
      CodeWriter::operator+=(&this->code_,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
    }
    this->cur_name_space_ = (Namespace *)old_size;
  }
  return;
}

Assistant:

void SetNameSpace(const Namespace *ns) {
    if (cur_name_space_ == ns) { return; }

    // Compute the size of the longest common namespace prefix.
    // If cur_name_space is A::B::C::D and ns is A::B::E::F::G,
    // the common prefix is A::B:: and we have old_size = 4, new_size = 5
    // and common_prefix_size = 2
    size_t old_size = cur_name_space_ ? cur_name_space_->components.size() : 0;
    size_t new_size = ns ? ns->components.size() : 0;

    size_t common_prefix_size = 0;
    while (common_prefix_size < old_size && common_prefix_size < new_size &&
           ns->components[common_prefix_size] ==
               cur_name_space_->components[common_prefix_size]) {
      common_prefix_size++;
    }

    // Close cur_name_space in reverse order to reach the common prefix.
    // In the previous example, D then C are closed.
    for (size_t j = old_size; j > common_prefix_size; --j) {
      code_ += "}  // pub mod " + cur_name_space_->components[j - 1];
    }
    if (old_size != common_prefix_size) { code_ += ""; }

    // open namespace parts to reach the ns namespace
    // in the previous example, E, then F, then G are opened
    for (auto j = common_prefix_size; j != new_size; ++j) {
      code_ += "#[allow(unused_imports, dead_code)]";
      code_ += "pub mod " + namer_.Namespace(ns->components[j]) + " {";
      // Generate local namespace imports.
      GenNamespaceImports(2);
    }
    if (new_size != common_prefix_size) { code_ += ""; }

    cur_name_space_ = ns;
  }